

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::BlockChecked
          (PeerManagerImpl *this,CBlock *block,BlockValidationState *state)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  byte bVar3;
  ModeState MVar4;
  NodeId nodeid;
  _List_node_base *id;
  _List_node_base *p_Var5;
  function<bool_(CNode_*)> func;
  bool bVar6;
  iterator __position;
  size_type sVar7;
  _Base_ptr p_Var8;
  _List_node_base *p_Var9;
  _Base_ptr p_Var10;
  _List_node_base *p_Var11;
  uint uVar12;
  long in_FS_OFFSET;
  PeerRef peer;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  uint256 hash;
  PeerRef peer_ref;
  undefined8 in_stack_ffffffffffffff58;
  CValidationInterface in_stack_ffffffffffffff68;
  NetEventsInterface in_stack_ffffffffffffff70;
  RecursiveMutex *local_88;
  bool local_80;
  uint256 local_78;
  undefined1 local_58 [24];
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = &cs_main;
  local_80 = false;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff78);
  CBlockHeader::GetHash(&local_78,&block->super_CBlockHeader);
  __position = std::
               _Rb_tree<uint256,_std::pair<const_uint256,_std::pair<long,_bool>_>,_std::_Select1st<std::pair<const_uint256,_std::pair<long,_bool>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_bool>_>_>_>
               ::find(&(this->mapBlockSource)._M_t,&local_78);
  MVar4 = (state->super_ValidationState<BlockValidationResult>).m_mode;
  if (MVar4 != M_VALID) {
    if (((MVar4 == M_INVALID) &&
        ((_Rb_tree_header *)__position._M_node !=
         &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header)) &&
       (p_Var8 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
       p_Var8 != (_Base_ptr)0x0)) {
      nodeid = *(NodeId *)(__position._M_node + 2);
      p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = &p_Var1->_M_header;
      do {
        if (nodeid <= *(long *)(p_Var8 + 1)) {
          p_Var10 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[*(long *)(p_Var8 + 1) < nodeid];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var10 != p_Var1) && (*(long *)(p_Var10 + 1) <= nodeid)) {
        bVar3 = *(byte *)&__position._M_node[2]._M_parent;
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
        MaybePunishNodeForBlock(this,nodeid,state,(bool)(bVar3 ^ 1),(string *)local_58);
        if ((PeerManagerImpl *)local_58._0_8_ != (PeerManagerImpl *)(local_58 + 0x10)) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
        }
      }
    }
    goto LAB_008d82d0;
  }
  bVar6 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
  if (bVar6) goto LAB_008d82d0;
  sVar7 = std::
          multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
          ::count(&this->mapBlocksInFlight,&local_78);
  if (((_Rb_tree_header *)__position._M_node ==
       &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header ||
       sVar7 != (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count) ||
     ((this->m_opts).ignore_incoming_txs != false)) goto LAB_008d82d0;
  id = *(_List_node_base **)(__position._M_node + 2);
  p_Var8 = (this->m_node_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_008d82b1:
    GetPeerRef((PeerManagerImpl *)&stack0xffffffffffffff68,(NodeId)this);
  }
  else {
    p_Var1 = &(this->m_node_states)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = &p_Var1->_M_header;
    do {
      if ((long)id <= *(long *)(p_Var8 + 1)) {
        p_Var10 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(long *)(p_Var8 + 1) < (long)id];
    } while (p_Var8 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var10 == p_Var1) || ((long)id < *(long *)(p_Var10 + 1)))
    goto LAB_008d82b1;
    GetPeerRef((PeerManagerImpl *)&stack0xffffffffffffff68,(NodeId)this);
    if (*(char *)((long)&p_Var10[4]._M_left + 2) == '\x01') {
      p_Var9 = (_List_node_base *)&this->lNodesAnnouncingHeaderAndIDs;
      p_Var11 = (this->lNodesAnnouncingHeaderAndIDs).super__List_base<long,_std::allocator<long>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      uVar12 = 0;
      if (p_Var11 != p_Var9) {
        do {
          if (p_Var11[1]._M_next == id) {
            psVar2 = &(this->lNodesAnnouncingHeaderAndIDs).
                      super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
            *psVar2 = *psVar2 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(p_Var11,0x18);
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = id;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar2 = &(this->lNodesAnnouncingHeaderAndIDs).
                      super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
            *psVar2 = *psVar2 + 1;
            goto LAB_008d82c1;
          }
          GetPeerRef((PeerManagerImpl *)local_58,(NodeId)this);
          if ((PeerManagerImpl *)local_58._0_8_ != (PeerManagerImpl *)0x0) {
            uVar12 = uVar12 + ((byte)*(int *)(local_58._0_8_ + 0x18) ^ 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          }
          p_Var11 = p_Var11->_M_next;
        } while (p_Var11 != p_Var9);
        uVar12 = (uint)(uVar12 == 1);
      }
      if (((in_stack_ffffffffffffff68._vptr_CValidationInterface != (_func_int **)0x0) &&
          (*(code *)(in_stack_ffffffffffffff68._vptr_CValidationInterface + 3) == (code)0x1)) &&
         ((2 < (this->lNodesAnnouncingHeaderAndIDs).super__List_base<long,_std::allocator<long>_>.
               _M_impl._M_node._M_size & (byte)uVar12) == 1)) {
        GetPeerRef((PeerManagerImpl *)local_58,(NodeId)this);
        if (((PeerManagerImpl *)local_58._0_8_ != (PeerManagerImpl *)0x0) &&
           ((char)*(int *)(local_58._0_8_ + 0x18) == '\0')) {
          p_Var11 = (((_List_base<long,_std::allocator<long>_> *)&p_Var9->_M_next)->_M_impl)._M_node
                    .super__List_node_base._M_next;
          p_Var5 = p_Var11[1]._M_next;
          p_Var11[1]._M_next = p_Var11->_M_next[1]._M_next;
          p_Var11->_M_next[1]._M_next = p_Var5;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
      }
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_40 = std::
                 _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:1419:31)>
                 ::_M_invoke;
      local_58._16_8_ =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:1419:31)>
           ::_M_manager;
      func.super__Function_base._M_functor._8_8_ = p_Var9;
      func.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff58;
      func.super__Function_base._M_manager =
           (_Manager_type)in_stack_ffffffffffffff68._vptr_CValidationInterface;
      func._M_invoker = (_Invoker_type)in_stack_ffffffffffffff70._vptr_NetEventsInterface;
      local_58._0_8_ = this;
      CConnman::ForNode(this->m_connman,(NodeId)id,func);
      if ((code *)local_58._16_8_ != (code *)0x0) {
        (*(code *)local_58._16_8_)(local_58,local_58,3);
      }
    }
  }
LAB_008d82c1:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      in_stack_ffffffffffffff70._vptr_NetEventsInterface !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               in_stack_ffffffffffffff70._vptr_NetEventsInterface);
  }
LAB_008d82d0:
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->mapBlockSource)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
    ::erase_abi_cxx11_((_Rb_tree<uint256,std::pair<uint256_const,std::pair<long,bool>>,std::_Select1st<std::pair<uint256_const,std::pair<long,bool>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::pair<long,bool>>>>
                        *)&this->mapBlockSource,__position);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::BlockChecked(const CBlock& block, const BlockValidationState& state)
{
    LOCK(cs_main);

    const uint256 hash(block.GetHash());
    std::map<uint256, std::pair<NodeId, bool>>::iterator it = mapBlockSource.find(hash);

    // If the block failed validation, we know where it came from and we're still connected
    // to that peer, maybe punish.
    if (state.IsInvalid() &&
        it != mapBlockSource.end() &&
        State(it->second.first)) {
            MaybePunishNodeForBlock(/*nodeid=*/ it->second.first, state, /*via_compact_block=*/ !it->second.second);
    }
    // Check that:
    // 1. The block is valid
    // 2. We're not in initial block download
    // 3. This is currently the best block we're aware of. We haven't updated
    //    the tip yet so we have no way to check this directly here. Instead we
    //    just check that there are currently no other blocks in flight.
    else if (state.IsValid() &&
             !m_chainman.IsInitialBlockDownload() &&
             mapBlocksInFlight.count(hash) == mapBlocksInFlight.size()) {
        if (it != mapBlockSource.end()) {
            MaybeSetPeerAsAnnouncingHeaderAndIDs(it->second.first);
        }
    }
    if (it != mapBlockSource.end())
        mapBlockSource.erase(it);
}